

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Skeleton::drawCapsule(Skeleton *this,Joint *joint)

{
  bool bVar1;
  reference ppJVar2;
  Skeleton *in_RSI;
  vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_> *in_RDI;
  Joint *child;
  iterator __end2;
  iterator __begin2;
  vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_> *__range2;
  GLfloat color [4];
  GLfloat white [4];
  GLUquadric *q;
  double r;
  double axisLength;
  Vector3D jointAxis;
  Vector3D jointScale;
  Vector3D jointRot;
  Vector3D jointPos;
  Joint *in_stack_ffffffffffffff20;
  __normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
  local_d0;
  Mesh **local_c8;
  Vector3D local_c0;
  Vector3D *axis;
  Skeleton *this_00;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  double local_80;
  double local_78;
  Vector3D local_70;
  Vector3D local_58;
  Vector3D local_40;
  double local_28;
  double local_20;
  Joint *in_stack_ffffffffffffffe8;
  
  Vector3D::Vector3D((Vector3D *)&local_28,&(in_RSI->super_SceneObject).position);
  Vector3D::Vector3D(&local_40,&(in_RSI->super_SceneObject).rotation);
  Vector3D::Vector3D(&local_58,&(in_RSI->super_SceneObject).scale);
  Vector3D::Vector3D(&local_70,
                     (Vector3D *)
                     &(in_RSI->joints).
                      super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  local_78 = Vector3D::norm((Vector3D *)0x21ee51);
  local_80 = (in_RSI->currentTransformation).entries[2].x;
  local_88 = gluNewQuadric();
  local_98 = 0x3f8000003f800000;
  local_90 = 0x3f8000003f800000;
  axis = (Vector3D *)0x0;
  this_00 = (Skeleton *)0x3e8000003e800000;
  glEnable(0xb50);
  glEnable(0x4000);
  glLightfv(0x4000,0x1201,&local_98);
  glMaterialfv(0x408,0x1201,&stack0xffffffffffffff58);
  glEnable(0xbe2);
  glBlendFunc(1);
  glPushMatrix();
  glTranslated(local_28,local_20,in_stack_ffffffffffffffe8);
  glRotatef((float)local_40.x,0x3f800000,0);
  glRotatef((float)local_40.y,0,0x3f800000);
  glRotatef((float)local_40.z,0,0,0x3f800000);
  glScalef((float)local_58.x,(float)local_58.y,(float)local_58.z);
  glPushMatrix();
  Vector3D::Vector3D(&local_c0,&local_70);
  setZAxis(this_00,axis);
  glPushMatrix();
  glRotated(0xc056800000000000,0x3ff0000000000000,0);
  drawSemisphere((GLdouble)in_stack_ffffffffffffff20,(GLint)((ulong)in_RDI >> 0x20),(GLint)in_RDI);
  glPopMatrix();
  gluCylinder(local_80,local_80,local_78,local_88,0x19);
  glPushMatrix();
  glTranslated(0,0,local_78);
  glRotated(0x4056800000000000,0x3ff0000000000000,0);
  drawSemisphere((GLdouble)in_stack_ffffffffffffff20,(GLint)((ulong)in_RDI >> 0x20),(GLint)in_RDI);
  glPopMatrix();
  glPopMatrix();
  glTranslated(local_70.x,local_70.y,local_70.z);
  local_c8 = &in_RSI->mesh;
  local_d0._M_current =
       (Joint **)
       std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>::
       begin(in_RDI);
  std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>::end
            (in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
                        *)in_stack_ffffffffffffff20,
                       (__normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    ppJVar2 = __gnu_cxx::
              __normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
              ::operator*(&local_d0);
    in_stack_ffffffffffffff20 = *ppJVar2;
    drawCapsule(in_RSI,in_stack_ffffffffffffffe8);
    __gnu_cxx::
    __normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
    ::operator++(&local_d0);
  }
  glPopMatrix();
  glDisable(0xbe2);
  gluDeleteQuadric(local_88);
  return;
}

Assistant:

void Skeleton::drawCapsule(Joint* joint) {
  Vector3D jointPos = joint->position;
  Vector3D jointRot = joint->rotation;
  Vector3D jointScale = joint->scale;
  Vector3D jointAxis = joint->axis;
  double axisLength = jointAxis.norm();
  double r = joint->capsuleRadius;
  GLUquadric* q = gluNewQuadric();
  GLfloat white[4] = {1., 1., 1., 1.};
  GLfloat color[4] = {0., 0., 0.25, .25};

  glEnable(GL_LIGHTING);
  glEnable(GL_LIGHT0);
  glLightfv(GL_LIGHT0, GL_DIFFUSE, white);
  glMaterialfv(GL_FRONT_AND_BACK, GL_DIFFUSE, color);

  glEnable(GL_BLEND);
  // glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
  glBlendFunc(GL_ONE, GL_ONE);

  glPushMatrix();

  glTranslated(jointPos.x, jointPos.y, jointPos.z);
  glRotatef(jointRot.x, 1.0f, 0.0f, 0.0f);
  glRotatef(jointRot.y, 0.0f, 1.0f, 0.0f);
  glRotatef(jointRot.z, 0.0f, 0.0f, 1.0f);
  glScalef(jointScale.x, jointScale.y, jointScale.z);

  glPushMatrix();
  setZAxis(jointAxis);

  glPushMatrix();
  glRotated(-90, 1, 0, 0);
  drawSemisphere(r, 25, 25);
  glPopMatrix();

  gluCylinder(q, r, r, axisLength, 25, 25);

  glPushMatrix();
  glTranslated(0, 0, axisLength);
  glRotated(90, 1, 0, 0);
  drawSemisphere(r, 25, 25);
  glPopMatrix();

  glPopMatrix();

  glTranslated(jointAxis.x, jointAxis.y, jointAxis.z);

  for (Joint* child : joint->kids) drawCapsule(child);

  glPopMatrix();

  glDisable(GL_BLEND);
  gluDeleteQuadric(q);
}